

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O0

void squall::detail::defraw
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,_func_SQInteger_HSQUIRRELVM *f)

{
  HSQOBJECT obj;
  SQChar *name_00;
  SQInteger in_stack_ffffffffffffffa8;
  HSQUIRRELVM v;
  HSQUIRRELVM v_00;
  HSQUIRRELVM v_01;
  _func_SQInteger_HSQUIRRELVM *f_local;
  string *name_local;
  HSQOBJECT *table_local;
  HSQUIRRELVM vm_local;
  
  v_00 = *(HSQUIRRELVM *)table;
  v_01 = (HSQUIRRELVM)(table->_unVal).pTable;
  obj._unVal.pTable = (SQTable *)name;
  obj._0_8_ = f;
  sq_pushobject(v_01,obj);
  v = vm;
  name_00 = (SQChar *)std::__cxx11::string::data();
  std::__cxx11::string::length();
  sq_pushstring((HSQUIRRELVM)name,(SQChar *)f,(SQInteger)v_01);
  sq_newclosure(vm,(SQFUNCTION)table,(SQUnsignedInteger)name);
  std::__cxx11::string::c_str();
  sq_setnativeclosurename(v_00,(SQInteger)vm,name_00);
  sq_newslot((HSQUIRRELVM)f,(SQInteger)v_01,(SQBool)v_00);
  sq_pop(v,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

inline
void defraw(
    HSQUIRRELVM vm, const HSQOBJECT& table,
    const string& name, SQInteger (*f)(HSQUIRRELVM)) {
    
    //sq_pushroottable(vm);
    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    sq_newclosure(vm, f, 0);
    sq_setnativeclosurename(vm, -1, name.c_str());
    sq_newslot(vm, -3, SQFalse);
    sq_pop(vm, 1);
}